

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

QList<int> * __thiscall
QColumnView::columnWidths(QList<int> *__return_storage_ptr__,QColumnView *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  uVar4 = *(ulong *)(lVar1 + 0x550);
  iVar2 = (int)uVar4;
  QList<int>::reserve(__return_storage_ptr__,(long)iVar2);
  uVar3 = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    QList<int>::append(__return_storage_ptr__,
                       *(parameter_type *)(*(long *)(lVar1 + 0x560) + uVar3 * 4));
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QColumnView::columnWidths() const
{
    Q_D(const QColumnView);
    QList<int> list;
    const int columnCount = d->columns.size();
    list.reserve(columnCount);
    for (int i = 0; i < columnCount; ++i)
        list.append(d->columnSizes.at(i));
    return list;
}